

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jp2.c
# Opt level: O0

opj_bool jp2_read_boxhdr(opj_common_ptr cinfo,opj_cio_t *cio,opj_jp2_box_t *box)

{
  int iVar1;
  uint uVar2;
  opj_cio_t *in_RDX;
  opj_cio_t *in_RSI;
  opj_common_ptr in_RDI;
  int in_stack_ffffffffffffffdc;
  
  iVar1 = cio_tell(in_RSI);
  in_RDX->openmode = iVar1;
  uVar2 = cio_read(in_RDX,in_stack_ffffffffffffffdc);
  *(uint *)&in_RDX->cinfo = uVar2;
  uVar2 = cio_read(in_RDX,in_stack_ffffffffffffffdc);
  *(uint *)((long)&in_RDX->cinfo + 4) = uVar2;
  if (*(int *)&in_RDX->cinfo == 1) {
    uVar2 = cio_read(in_RDX,in_stack_ffffffffffffffdc);
    if (uVar2 != 0) {
      opj_event_msg(in_RDI,1,"Cannot handle box sizes higher than 2^32\n");
      return 0;
    }
    uVar2 = cio_read(in_RDX,in_stack_ffffffffffffffdc);
    *(uint *)&in_RDX->cinfo = uVar2;
    if (*(int *)&in_RDX->cinfo == 0) {
      iVar1 = cio_numbytesleft(in_RSI);
      *(int *)&in_RDX->cinfo = iVar1 + 0xc;
    }
  }
  else if (*(int *)&in_RDX->cinfo == 0) {
    iVar1 = cio_numbytesleft(in_RSI);
    *(int *)&in_RDX->cinfo = iVar1 + 8;
  }
  return 1;
}

Assistant:

static opj_bool jp2_read_boxhdr(opj_common_ptr cinfo, opj_cio_t *cio, opj_jp2_box_t *box) {
	box->init_pos = cio_tell(cio);
	box->length = cio_read(cio, 4);
	box->type = cio_read(cio, 4);
	if (box->length == 1) {
		if (cio_read(cio, 4) != 0) {
			opj_event_msg(cinfo, EVT_ERROR, "Cannot handle box sizes higher than 2^32\n");
			return OPJ_FALSE;
		}
		box->length = cio_read(cio, 4);
		if (box->length == 0) 
			box->length = cio_numbytesleft(cio) + 12;
	}
	else if (box->length == 0) {
		box->length = cio_numbytesleft(cio) + 8;
	}
	
	return OPJ_TRUE;
}